

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::Matchers::Floating::WithinRelMatcher::WithinRelMatcher
          (WithinRelMatcher *this,double target,double epsilon)

{
  undefined8 *in_RDI;
  undefined8 in_XMM0_Qa;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  ReusableStringStream *in_stack_ffffffffffffff48;
  MatcherBase<double> *in_stack_ffffffffffffff50;
  string *in_stack_ffffffffffffff70;
  ReusableStringStream *in_stack_ffffffffffffff80;
  
  Impl::MatcherBase<double>::MatcherBase(in_stack_ffffffffffffff50);
  *in_RDI = &PTR__WithinRelMatcher_00246d58;
  in_RDI[5] = &DAT_00246d88;
  in_RDI[6] = in_XMM0_Qa;
  in_RDI[7] = CONCAT44(in_XMM1_Db,in_XMM1_Da);
  if ((double)in_RDI[7] < 0.0) {
    ReusableStringStream::ReusableStringStream(in_stack_ffffffffffffff80);
    ReusableStringStream::operator<<
              ((ReusableStringStream *)in_stack_ffffffffffffff50,
               (char (*) [59])in_stack_ffffffffffffff48);
    ReusableStringStream::str_abi_cxx11_(in_stack_ffffffffffffff48);
    throw_domain_error(in_stack_ffffffffffffff70);
  }
  if (1.0 < (double)in_RDI[7] || (double)in_RDI[7] == 1.0) {
    ReusableStringStream::ReusableStringStream(in_stack_ffffffffffffff80);
    ReusableStringStream::operator<<
              ((ReusableStringStream *)in_stack_ffffffffffffff50,
               (char (*) [59])in_stack_ffffffffffffff48);
    ReusableStringStream::str_abi_cxx11_(in_stack_ffffffffffffff48);
    throw_domain_error(in_stack_ffffffffffffff70);
  }
  return;
}

Assistant:

WithinRelMatcher::WithinRelMatcher(double target, double epsilon):
        m_target(target),
        m_epsilon(epsilon){
        CATCH_ENFORCE(m_epsilon >= 0., "Relative comparison with epsilon <  0 does not make sense.");
        CATCH_ENFORCE(m_epsilon  < 1., "Relative comparison with epsilon >= 1 does not make sense.");
    }